

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O3

int bsdtar_getopt(bsdtar *bsdtar)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  bsdtar_option *pbVar7;
  bsdtar_option *pbVar8;
  int iVar9;
  uint __c;
  size_t __n;
  char *pcVar10;
  char *__s2;
  bsdtar_option *pbVar11;
  char *local_48;
  bsdtar_option *local_38;
  
  iVar3 = bsdtar->getopt_state;
  iVar9 = 0x3f;
  do {
    bsdtar->argument = (char *)0x0;
    switch(iVar3) {
    case 0:
      ppcVar2 = bsdtar->argv;
      bsdtar->argv = ppcVar2 + 1;
      iVar3 = bsdtar->argc;
      bsdtar->argc = iVar3 + -1;
      if (ppcVar2[1] == (char *)0x0) {
        return -1;
      }
      if (*ppcVar2[1] != '-') {
        bsdtar->getopt_state = 1;
        bsdtar->argv = ppcVar2 + 2;
        bsdtar->getopt_word = ppcVar2[1];
        bsdtar->argc = iVar3 + -2;
        goto switchD_00110071_caseD_1;
      }
      break;
    case 1:
switchD_00110071_caseD_1:
      pcVar10 = bsdtar->getopt_word;
      bsdtar->getopt_word = pcVar10 + 1;
      cVar1 = *pcVar10;
      __c = (uint)cVar1;
      if (cVar1 != '\0') {
        pvVar4 = memchr("aBb:C:cf:HhI:JjkLlmnOoPpqrSs:T:tUuvW:wX:xyZz",__c,0x2d);
        if (pvVar4 == (void *)0x0) {
          return 0x3f;
        }
        if (*(char *)((long)pvVar4 + 1) != ':') {
          return __c;
        }
        pcVar10 = *bsdtar->argv;
        bsdtar->argument = pcVar10;
        if (pcVar10 != (char *)0x0) {
          bsdtar->argv = bsdtar->argv + 1;
          bsdtar->argc = bsdtar->argc + -1;
          return __c;
        }
        pcVar10 = "Option %c requires an argument";
        goto LAB_00110423;
      }
      break;
    case 2:
      goto switchD_00110071_caseD_2;
    case 3:
      pcVar5 = bsdtar->getopt_word;
      goto LAB_0011015b;
    case 4:
      goto switchD_00110071_caseD_4;
    default:
      goto switchD_00110071_default;
    }
    bsdtar->getopt_state = 2;
switchD_00110071_caseD_2:
    ppcVar2 = bsdtar->argv;
    pcVar10 = *ppcVar2;
    if ((pcVar10 == (char *)0x0) || (*pcVar10 != '-')) {
      return -1;
    }
    if ((pcVar10[1] == '-') && (pcVar10[2] == '\0')) {
      bsdtar->argv = ppcVar2 + 1;
      bsdtar->argc = bsdtar->argc + -1;
      return -1;
    }
    bsdtar->argv = ppcVar2 + 1;
    pcVar5 = *ppcVar2;
    bsdtar->getopt_word = pcVar5;
    bsdtar->argc = bsdtar->argc + -1;
    if (pcVar5[1] == '-') {
      pcVar10 = pcVar5 + 2;
      bsdtar->getopt_word = pcVar10;
      local_48 = "--";
      goto LAB_00110292;
    }
    pcVar5 = pcVar5 + 1;
    bsdtar->getopt_state = 3;
LAB_0011015b:
    pcVar10 = pcVar5 + 1;
    bsdtar->getopt_word = pcVar10;
    cVar1 = *pcVar5;
    __c = (uint)cVar1;
    if (cVar1 != '\0') {
      pvVar4 = memchr("aBb:C:cf:HhI:JjkLlmnOoPpqrSs:T:tUuvW:wX:xyZz",__c,0x2d);
      if (pvVar4 == (void *)0x0) {
        return 0x3f;
      }
      if (*(char *)((long)pvVar4 + 1) != ':') {
        return __c;
      }
      if (*pcVar10 == '\0') {
        pcVar10 = *bsdtar->argv;
        bsdtar->getopt_word = pcVar10;
        if (pcVar10 == (char *)0x0) {
          pcVar10 = "Option -%c requires an argument";
LAB_00110423:
          lafe_warnc(0,pcVar10,(ulong)__c);
          return 0x3f;
        }
        bsdtar->argv = bsdtar->argv + 1;
        bsdtar->argc = bsdtar->argc + -1;
      }
      if (cVar1 != 'W') {
        bsdtar->getopt_state = 2;
        bsdtar->argument = pcVar10;
        return __c;
      }
      local_48 = "-W ";
      goto LAB_00110292;
    }
    bsdtar->getopt_state = 2;
    iVar3 = 2;
  } while( true );
switchD_00110071_caseD_4:
  pcVar10 = bsdtar->getopt_word;
  local_48 = "--";
LAB_00110292:
  bsdtar->getopt_state = 2;
  pcVar5 = strchr(pcVar10,0x3d);
  if (pcVar5 == (char *)0x0) {
    __n = strlen(pcVar10);
  }
  else {
    __n = (long)pcVar5 - (long)pcVar10;
    bsdtar->argument = pcVar5 + 1;
  }
  cVar1 = *pcVar10;
  pbVar11 = tar_longopts;
  __s2 = "absolute-paths";
  local_38 = (bsdtar_option *)0x0;
  pbVar7 = (bsdtar_option *)0x0;
  do {
    pbVar8 = pbVar7;
    if (((*__s2 == cVar1) && (iVar3 = strncmp(pcVar10,__s2,__n), iVar3 == 0)) &&
       (sVar6 = strlen(__s2), pbVar8 = pbVar11, local_38 = pbVar7, sVar6 == __n)) goto LAB_0011039d;
    __s2 = pbVar11[1].name;
    pbVar11 = pbVar11 + 1;
    pbVar7 = pbVar8;
  } while (__s2 != (char *)0x0);
  if (pbVar8 == (bsdtar_option *)0x0) {
    lafe_warnc(0,"Option %s%s is not supported",local_48,pcVar10);
    return 0x3f;
  }
  if (local_38 != (bsdtar_option *)0x0) {
    lafe_warnc(0,"Ambiguous option %s%s (matches --%s and --%s)",local_48,pcVar10,pbVar8->name,
               local_38->name);
    return 0x3f;
  }
LAB_0011039d:
  if (pbVar8->required == 0) {
    if (pcVar5 != (char *)0x0) {
      pcVar10 = pbVar8->name;
      pcVar5 = "Option %s%s does not allow an argument";
LAB_0011043b:
      lafe_warnc(0,pcVar5,local_48,pcVar10);
      return 0x3f;
    }
  }
  else if (pcVar5 == (char *)0x0) {
    pcVar10 = *bsdtar->argv;
    bsdtar->argument = pcVar10;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = pbVar8->name;
      pcVar5 = "Option %s%s requires an argument";
      goto LAB_0011043b;
    }
    bsdtar->argv = bsdtar->argv + 1;
    bsdtar->argc = bsdtar->argc + -1;
  }
  iVar9 = pbVar8->equivalent;
switchD_00110071_default:
  return iVar9;
}

Assistant:

int
bsdtar_getopt(struct bsdtar *bsdtar)
{
	enum { state_start = 0, state_old_tar, state_next_word,
	       state_short, state_long };

	const struct bsdtar_option *popt, *match = NULL, *match2 = NULL;
	const char *p, *long_prefix = "--";
	size_t optlength;
	int opt = '?';
	int required = 0;

	bsdtar->argument = NULL;

	/* First time through, initialize everything. */
	if (bsdtar->getopt_state == state_start) {
		/* Skip program name. */
		++bsdtar->argv;
		--bsdtar->argc;
		if (*bsdtar->argv == NULL)
			return (-1);
		/* Decide between "new style" and "old style" arguments. */
		if (bsdtar->argv[0][0] == '-') {
			bsdtar->getopt_state = state_next_word;
		} else {
			bsdtar->getopt_state = state_old_tar;
			bsdtar->getopt_word = *bsdtar->argv++;
			--bsdtar->argc;
		}
	}

	/*
	 * We're parsing old-style tar arguments
	 */
	if (bsdtar->getopt_state == state_old_tar) {
		/* Get the next option character. */
		opt = *bsdtar->getopt_word++;
		if (opt == '\0') {
			/* New-style args can follow old-style. */
			bsdtar->getopt_state = state_next_word;
		} else {
			/* See if it takes an argument. */
			p = strchr(short_options, opt);
			if (p == NULL)
				return ('?');
			if (p[1] == ':') {
				bsdtar->argument = *bsdtar->argv;
				if (bsdtar->argument == NULL) {
					lafe_warnc(0,
					    "Option %c requires an argument",
					    opt);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
		}
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (bsdtar->getopt_state == state_next_word) {
		/* No more arguments, so no more options. */
		if (bsdtar->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (bsdtar->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(bsdtar->argv[0], "--") == 0) {
			++bsdtar->argv;
			--bsdtar->argc;
			return (-1);
		}
		/* Get next word for parsing. */
		bsdtar->getopt_word = *bsdtar->argv++;
		--bsdtar->argc;
		if (bsdtar->getopt_word[1] == '-') {
			/* Set up long option parser. */
			bsdtar->getopt_state = state_long;
			bsdtar->getopt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			bsdtar->getopt_state = state_short;
			++bsdtar->getopt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (bsdtar->getopt_state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *bsdtar->getopt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			bsdtar->getopt_state = state_next_word;
			return bsdtar_getopt(bsdtar);
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, bsdtar->getopt_word already points to it. */
			if (bsdtar->getopt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				bsdtar->getopt_word = *bsdtar->argv;
				if (bsdtar->getopt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
			if (opt == 'W') {
				bsdtar->getopt_state = state_long;
				long_prefix = "-W "; /* For clearer errors. */
			} else {
				bsdtar->getopt_state = state_next_word;
				bsdtar->argument = bsdtar->getopt_word;
			}
		}
	}

	/* We're reading a long option, including -W long=arg convention. */
	if (bsdtar->getopt_state == state_long) {
		/* After this long option, we'll be starting a new word. */
		bsdtar->getopt_state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(bsdtar->getopt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - bsdtar->getopt_word);
			bsdtar->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(bsdtar->getopt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = tar_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != bsdtar->getopt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(bsdtar->getopt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, bsdtar->getopt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, bsdtar->getopt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (bsdtar->argument == NULL) {
				bsdtar->argument = *bsdtar->argv;
				if (bsdtar->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (bsdtar->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}